

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tfHeader.c
# Opt level: O0

_Bool headerIsValid(ThreefishKey_t *tf_key,chunk *header,uint64_t *file_size)

{
  size_t __nmemb;
  _Bool _Var1;
  uint64_t *header_00;
  uint64_t *header_copy;
  uint64_t header_byte_size;
  _Bool success;
  uint64_t *file_size_local;
  chunk *header_local;
  ThreefishKey_t *tf_key_local;
  
  if (header == (chunk *)0x0) {
    tf_key_local._7_1_ = false;
  }
  else {
    __nmemb = header->data_size;
    header_00 = (uint64_t *)calloc(__nmemb,1);
    if (header_00 == (uint64_t *)0x0) {
      perror("Error unable to allocate memory for header check\n");
      tf_key_local._7_1_ = false;
    }
    else {
      memcpy(header_00,header->data,__nmemb);
      _Var1 = decryptHeader(tf_key,header_00);
      if (_Var1) {
        _Var1 = checkHeader(header_00,file_size,(SkeinSize_t)tf_key->stateSize);
        if (_Var1) {
          header->action = '\x04';
        }
        else {
          perror(
                "Header check failed either password is incorrect or not a threefizer encrypted file\n"
                );
        }
      }
      tf_key_local._7_1_ = true;
    }
  }
  return tf_key_local._7_1_;
}

Assistant:

bool headerIsValid(ThreefishKey_t* tf_key,
                   chunk* header,
                   uint64_t* file_size)
{
    if(header == NULL) { return false; }

    bool success = true;
    const uint64_t header_byte_size = header->data_size;

    //we make a copy of the header so we can pass just the header
    uint64_t* header_copy = calloc(header_byte_size, sizeof(uint8_t));

    if(header_copy == NULL)
    {
        perror("Error unable to allocate memory for header check\n");
        return false;
    }

    memcpy(header_copy, header->data, header_byte_size);

    if(decryptHeader(tf_key, header_copy))
    {
        if(checkHeader(header_copy, file_size, tf_key->stateSize))
        {
            header->action = GEN_MAC;
            success = true;
        }
        else
        {
            perror("Header check failed either password is incorrect or not a threefizer encrypted file\n");
        }
    }

    return success;
}